

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_chain_methods<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
                *matrix)

{
  pointer pSVar1;
  long lVar2;
  undefined4 local_250;
  int local_24c;
  undefined4 *local_248;
  int *local_240;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  undefined4 **local_220;
  undefined **local_218;
  undefined1 local_210;
  undefined8 *local_208;
  int **local_200;
  undefined1 local_1f8 [8];
  undefined8 local_1f0;
  shared_count sStack_1e8;
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined8 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x358);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&(pSVar1->column_)._M_t._M_impl + 0x28) == 0) {
    local_24c = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(pSVar1->column_)._M_t._M_impl + 8));
    local_24c = *(int *)(*(long *)(lVar2 + 0x20) + 0x18);
  }
  local_240 = &local_24c;
  local_1f8[0] = local_24c == 5;
  local_248 = &local_250;
  local_250 = 5;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_200 = &local_240;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00229940;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x358,1,2,2,"matrix[0].get_pivot()",&local_218,"5",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x359);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pSVar1[1].column_._M_t._M_impl + 0x28) == 0) {
    local_24c = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&pSVar1[1].column_._M_t._M_impl + 8));
    local_24c = *(int *)(*(long *)(lVar2 + 0x20) + 0x18);
  }
  local_250 = 6;
  local_1f8[0] = local_24c == 6;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00229940;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  local_200 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x359,1,2,2,"matrix[1].get_pivot()",&local_218,"6",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x35a);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pSVar1[2].column_._M_t._M_impl + 0x28) == 0) {
    local_24c = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&pSVar1[2].column_._M_t._M_impl + 8));
    local_24c = *(int *)(*(long *)(lVar2 + 0x20) + 0x18);
  }
  local_250 = 6;
  local_1f8[0] = local_24c == 6;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00229940;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  local_200 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x35a,1,2,2,"matrix[2].get_pivot()",&local_218,"6",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x35b);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pSVar1[3].column_._M_t._M_impl + 0x28) == 0) {
    local_24c = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&pSVar1[3].column_._M_t._M_impl + 8));
    local_24c = *(int *)(*(long *)(lVar2 + 0x20) + 0x18);
  }
  local_250 = 0xffffffff;
  local_1f8[0] = local_24c == -1;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00229940;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  local_200 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x35b,1,2,2,"matrix[3].get_pivot()",&local_218,"-1",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x35c);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pSVar1[4].column_._M_t._M_impl + 0x28) == 0) {
    local_24c = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&pSVar1[4].column_._M_t._M_impl + 8));
    local_24c = *(int *)(*(long *)(lVar2 + 0x20) + 0x18);
  }
  local_250 = 5;
  local_1f8[0] = local_24c == 5;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00229940;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  local_200 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x35c,1,2,2,"matrix[4].get_pivot()",&local_218,"5",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x35d);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  pSVar1 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pSVar1[5].column_._M_t._M_impl + 0x28) == 0) {
    local_24c = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&pSVar1[5].column_._M_t._M_impl + 8));
    local_24c = *(int *)(*(long *)(lVar2 + 0x20) + 0x18);
  }
  local_250 = 6;
  local_1f8[0] = local_24c == 6;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_00229940;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  local_200 = &local_240;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x35d,1,2,2,"matrix[5].get_pivot()",&local_218,"6",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x368);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_24c = (((matrix->
                super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_1f8[0] = local_24c == 4;
  local_250 = 4;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_002296c0;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_240;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x368,1,2,2,"matrix[0].get_dimension()",&local_218,"4",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x369);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_24c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_1f8[0] = local_24c == 4;
  local_250 = 4;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_002296c0;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_240;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x369,1,2,2,"matrix[1].get_dimension()",&local_218,"4",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x36a);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_24c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_1f8[0] = local_24c == 4;
  local_250 = 4;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_002296c0;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_240;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x36a,1,2,2,"matrix[2].get_dimension()",&local_218,"4",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x36b);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_24c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_1f8[0] = local_24c == 4;
  local_250 = 4;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_002296c0;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_240;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x36b,1,2,2,"matrix[3].get_dimension()",&local_218,"4",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x36c);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_24c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_1f8[0] = local_24c == 4;
  local_250 = 4;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_002296c0;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_240;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x36c,1,2,2,"matrix[4].get_dimension()",&local_218,"4",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x36d);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00229440;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_24c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_1f8[0] = local_24c == 4;
  local_250 = 4;
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_240 = &local_24c;
  local_210 = 0;
  local_218 = &PTR__lazy_ostream_002296c0;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_240;
  local_248 = &local_250;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_002296c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (local_1f8,&local_1e0,&local_1c0,0x36d,1,2,2,"matrix[5].get_dimension()",&local_218,"4",
             &local_238);
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  return;
}

Assistant:

void column_test_boundary_chain_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[1].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[2].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[3].get_pivot(), -1);
  BOOST_CHECK_EQUAL(matrix[4].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[5].get_pivot(), 6);

  if constexpr (!is_z2<Column>()) {
    BOOST_CHECK_EQUAL(matrix[0].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[1].get_pivot_value(), 1u);
    BOOST_CHECK_EQUAL(matrix[2].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[3].get_pivot_value(), 0u);
    BOOST_CHECK_EQUAL(matrix[4].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[5].get_pivot_value(), 1u);
  }

  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}